

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O3

int Fra_BmcNodesAreEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  piVar3 = *(int **)((long)(pObj0->field_5).pData + 0x40);
  iVar1 = *piVar3;
  iVar2 = piVar3[2];
  if (iVar1 < iVar2) {
    lVar4 = *(long *)((long)(pObj1->field_5).pData + 0x40);
    lVar5 = 0;
    do {
      uVar7 = *(ulong *)((long)pObj0->Id * (long)iVar2 * 8 + (long)iVar1 * 8 +
                         *(long *)(piVar3 + 0xc) + lVar5 * 8) & 0xfffffffffffffffe;
      uVar6 = *(ulong *)((long)*(int *)(lVar4 + 8) * (long)pObj1->Id * 8 + (long)iVar1 * 8 +
                         *(long *)(lVar4 + 0x30) + lVar5 * 8) & 0xfffffffffffffffe;
      if ((uVar7 != uVar6) &&
         (1 < (*(ulong *)(*(long *)(*(long *)(*(long *)(uVar6 + 0x28) + 0x40) + 0x38) +
                         (long)*(int *)(uVar6 + 0x24) * 8) ^
              *(ulong *)(*(long *)(*(long *)(*(long *)(uVar7 + 0x28) + 0x40) + 0x38) +
                        (long)*(int *)(uVar7 + 0x24) * 8)))) {
        return 0;
      }
      lVar5 = lVar5 + 1;
    } while (iVar2 - iVar1 != (int)lVar5);
  }
  return 1;
}

Assistant:

int Fra_BmcNodesAreEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj0->pData;
    Aig_Obj_t * pObjFrames0, * pObjFrames1;
    Aig_Obj_t * pObjFraig0, * pObjFraig1;
    int i;
    for ( i = p->pBmc->nPref; i < p->pBmc->nFramesAll; i++ )
    {
        pObjFrames0 = Aig_Regular( Bmc_ObjFrames(pObj0, i) );
        pObjFrames1 = Aig_Regular( Bmc_ObjFrames(pObj1, i) );
        if ( pObjFrames0 == pObjFrames1 )
            continue;
        pObjFraig0 = Aig_Regular( Bmc_ObjFraig(pObjFrames0) );
        pObjFraig1 = Aig_Regular( Bmc_ObjFraig(pObjFrames1) );
        if ( pObjFraig0 != pObjFraig1 )
            return 0;
    }
    return 1;
}